

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O2

bool __thiscall SectionHdrWrapper::reloadName(SectionHdrWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  QArrayDataPointer<char16_t> QStack_48;
  QArrayDataPointer<char16_t> local_30;
  long *plVar2;
  
  iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    plVar3 = (long *)this->name;
    if (plVar3 == (long *)0x0) {
      plVar3 = (long *)calloc(10,1);
      this->name = (char *)plVar3;
    }
    else if (*plVar3 == *plVar2) goto LAB_00126234;
    *(undefined2 *)(plVar3 + 1) = 0;
    *plVar3 = 0;
    *(long *)this->name = *plVar2;
    QString::operator=(&this->mappedName,this->name);
    if ((this->mappedName).d.size == 0) {
      QString::number((ulong)&QStack_48,(int)this->sectNum);
      operator+((QString *)&local_30,"#",(QString *)&QStack_48);
      QString::operator=(&this->mappedName,(QString *)&local_30);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    }
  }
LAB_00126234:
  return plVar2 != (long *)0x0;
}

Assistant:

bool SectionHdrWrapper::reloadName()
{
    IMAGE_SECTION_HEADER* header = (IMAGE_SECTION_HEADER*) getPtr();
    if (!header) return false;

    if (this->name) {
        if (memcmp(this->name, header->Name, SECNAME_LEN) == 0) {
            return true; //no need to reload
        }
    }
    const size_t BUF_LEN = SECNAME_LEN + 2;
    if (!this->name) {
        this->name = (char*)::calloc(BUF_LEN, 1);
    }
    ::memset(this->name, 0, BUF_LEN);
    ::memcpy(this->name, header->Name, SECNAME_LEN);
    this->mappedName = this->name;
    if (this->mappedName.length() == 0) {
        this->mappedName = "#" + QString::number(this->sectNum, 10);
    }
    return true;
}